

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextChild(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  if (cur != (xmlNodePtr)0x0) {
    if ((cur->type != XML_DOCUMENT_NODE) && (cur->type != XML_HTML_DOCUMENT_NODE)) {
      return cur->next;
    }
    return (xmlNodePtr)0x0;
  }
  if (ctxt->context->node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  xVar1 = ctxt->context->node->type;
  if (xVar1 != XML_ELEMENT_NODE) {
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      return (xmlNodePtr)0x0;
    }
    if (5 < xVar1 - XML_TEXT_NODE) {
      if (xVar1 - XML_DOCUMENT_NODE < 3) {
LAB_00228e80:
        return ctxt->context->node->children;
      }
      if (xVar1 != XML_NOTATION_NODE) {
        if (xVar1 == XML_HTML_DOCUMENT_NODE) goto LAB_00228e80;
        if (xVar1 != XML_DTD_NODE) {
          if (xVar1 - XML_ELEMENT_DECL < 6) {
            return (xmlNodePtr)0x0;
          }
          return (xmlNodePtr)0x0;
        }
      }
    }
  }
  return ctxt->context->node->children;
}

Assistant:

xmlNodePtr
xmlXPathNextChild(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
	if (ctxt->context->node == NULL) return(NULL);
	switch (ctxt->context->node->type) {
            case XML_ELEMENT_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
		return(ctxt->context->node->children);
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
		return(((xmlDocPtr) ctxt->context->node)->children);
	    case XML_ELEMENT_DECL:
	    case XML_ATTRIBUTE_DECL:
	    case XML_ENTITY_DECL:
            case XML_ATTRIBUTE_NODE:
	    case XML_NAMESPACE_DECL:
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		return(NULL);
	}
	return(NULL);
    }
    if ((cur->type == XML_DOCUMENT_NODE) ||
        (cur->type == XML_HTML_DOCUMENT_NODE))
	return(NULL);
    return(cur->next);
}